

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O3

int accum_state_fullvar(vector_t ****var,vector_t ***mean,float32 ***dnom,vector_t **feat,
                       uint32 n_feat,uint32 *veclen,uint32 *sseq,uint32 *ci_sseq,uint32 n_frame)

{
  uint uVar1;
  vector_t pfVar2;
  vector_t pfVar3;
  float32 *x;
  float32 **a;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint local_7c;
  ulong local_78;
  
  if (n_frame != 0) {
    local_78 = 0;
    do {
      uVar4 = 0;
      local_7c = 0;
      if (ci_sseq != (uint32 *)0x0 && sseq != (uint32 *)0x0) {
        local_7c = sseq[local_78];
        uVar4 = ci_sseq[local_78];
      }
      if (n_feat != 0) {
        uVar6 = (ulong)local_7c;
        uVar7 = 0;
        do {
          x = (float32 *)
              __ckd_calloc__((ulong)veclen[uVar7],4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/accum.c"
                             ,0xb6);
          a = (float32 **)
              __ckd_calloc_2d__((ulong)veclen[uVar7],(ulong)veclen[uVar7],4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/accum.c"
                                ,0xb7);
          *dnom[uVar6][uVar7] = (float32)((float)*dnom[uVar6][uVar7] + 1.0);
          if (local_7c != uVar4) {
            *dnom[uVar4][uVar7] = (float32)((float)*dnom[uVar4][uVar7] + 1.0);
          }
          uVar1 = veclen[uVar7];
          if ((ulong)uVar1 != 0) {
            pfVar2 = feat[local_78][uVar7];
            pfVar3 = *mean[uVar6][uVar7];
            uVar5 = 0;
            do {
              x[uVar5] = (float32)(pfVar2[uVar5] - pfVar3[uVar5]);
              uVar5 = uVar5 + 1;
            } while (uVar1 != uVar5);
          }
          outerproduct(a,x,x,uVar1);
          matrixadd((float32 **)*var[uVar6][uVar7],a,veclen[uVar7]);
          if (local_7c != uVar4) {
            uVar1 = veclen[uVar7];
            if ((ulong)uVar1 != 0) {
              pfVar2 = feat[local_78][uVar7];
              pfVar3 = *mean[uVar4][uVar7];
              uVar5 = 0;
              do {
                x[uVar5] = (float32)(pfVar2[uVar5] - pfVar3[uVar5]);
                uVar5 = uVar5 + 1;
              } while (uVar1 != uVar5);
            }
            outerproduct(a,x,x,uVar1);
            matrixadd((float32 **)*var[uVar4][uVar7],a,veclen[uVar7]);
          }
          ckd_free(x);
          ckd_free_2d(a);
          uVar7 = uVar7 + 1;
        } while (uVar7 != n_feat);
      }
      local_78 = local_78 + 1;
    } while (local_78 != n_frame);
  }
  return 0;
}

Assistant:

int
accum_state_fullvar(vector_t ****var,
		    vector_t ***mean,
		    float32  ***dnom,
		    vector_t **feat,
		    uint32 n_feat,
		    const uint32 *veclen,
		    uint32 *sseq,
		    uint32 *ci_sseq,
		    uint32 n_frame)
{
    uint32 t;		/* time (in frames) */
    uint32 s;		/* a tied state */
    uint32 ci_s;	/* a CI tied state */
    uint32 f;		/* a feature stream idx */
    uint32 c;		/* a vector component idx */

    for (t = 0; t < n_frame; t++) {

	if (sseq && ci_sseq) {
	    /* get the tied state for time t */
	    s = sseq[t];
	
	    /* get the CI state as well */
	    ci_s = ci_sseq[t];
	}
	else {
	    s = 0;
	    ci_s = 0;
	}

	for (f = 0; f < n_feat; f++) {
	    vector_t dvec = ckd_calloc(veclen[f], sizeof(float32));
	    vector_t *cov = (vector_t *)ckd_calloc_2d(veclen[f], veclen[f], sizeof(float32));

	    dnom[s][f][0] += 1.0;
	    if (s != ci_s) {
		dnom[ci_s][f][0] += 1.0;
	    }
	    for (c = 0; c < veclen[f]; c++)
		dvec[c] = feat[t][f][c] - mean[s][f][0][c];

	    outerproduct(cov, dvec, dvec, veclen[f]);
	    matrixadd(var[s][f][0], cov, veclen[f]);

	    if (s != ci_s) {
		for (c = 0; c < veclen[f]; c++)
		    dvec[c] = feat[t][f][c] - mean[ci_s][f][0][c];
		outerproduct(cov, dvec, dvec, veclen[f]);
		matrixadd(var[ci_s][f][0], cov, veclen[f]);
	    }
	    ckd_free(dvec);
	    ckd_free_2d((void **)cov);
	}
    }
    return 0;
}